

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

char * gotcha_getenv(char *name)

{
  char *in_two;
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  int max_length;
  
  sVar2 = gotcha_strlen(name);
  max_length = (int)sVar2;
  puVar3 = ___environ;
  while( true ) {
    in_two = (char *)*puVar3;
    if (in_two == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = gotcha_strncmp(name,in_two,max_length);
    if ((iVar1 == 0) && (in_two[max_length] == '=')) break;
    puVar3 = puVar3 + 1;
  }
  return in_two + (long)max_length + 1;
}

Assistant:

char *gotcha_getenv(const char *name) 
{
   char **s;
   int name_len;

   name_len = gotcha_strlen(name);
   for (s = __environ; *s; s++) {
      if (gotcha_strncmp(name, *s, name_len) != 0)
         continue;
      if ((*s)[name_len] != '=')
         continue;
      return (*s) + name_len + 1;
   }
   return NULL;
}